

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedFieldInsertionIteratorsTest_Fibonacci_Test::TestBody
          (RepeatedFieldInsertionIteratorsTest_Fibonacci_Test *this)

{
  bool bVar1;
  RepeatedField<int> *pRVar2;
  char *pcVar3;
  char *in_R9;
  string local_e0;
  AssertHelper local_c0;
  Message local_b8;
  _List_node_base *local_b0;
  RepeatedIterator<const_int> local_a8;
  RepeatedIterator<const_int> local_a0;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_60 [3];
  Message local_48;
  pointer local_40;
  _List_iterator<int> local_38;
  _List_iterator<int> local_30;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  RepeatedFieldInsertionIteratorsTest_Fibonacci_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::begin
                 (&(this->super_RepeatedFieldInsertionIteratorsTest).fibonacci);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<int,_std::allocator<int>_>::end
                 (&(this->super_RepeatedFieldInsertionIteratorsTest).fibonacci);
  pRVar2 = proto2_unittest::TestAllTypes::repeated_int32
                     (&(this->super_RepeatedFieldInsertionIteratorsTest).protobuffer);
  local_40 = (pointer)RepeatedField<int>::begin(pRVar2);
  local_21 = std::
             equal<std::_List_iterator<int>,google::protobuf::internal::RepeatedIterator<int_const>>
                       (local_30,local_38,(RepeatedIterator<const_int>)local_40);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_20,
               (AssertionResult *)
               "std::equal(fibonacci.begin(), fibonacci.end(), protobuffer.repeated_int32().begin())"
               ,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x535,pcVar3);
    testing::internal::AssertHelper::operator=(local_60,&local_48);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  pRVar2 = proto2_unittest::TestAllTypes::repeated_int32
                     (&(this->super_RepeatedFieldInsertionIteratorsTest).protobuffer);
  local_a0.it_ = (pointer)RepeatedField<int>::begin(pRVar2);
  pRVar2 = proto2_unittest::TestAllTypes::repeated_int32
                     (&(this->super_RepeatedFieldInsertionIteratorsTest).protobuffer);
  local_a8.it_ = (pointer)RepeatedField<int>::end(pRVar2);
  local_b0 = (_List_node_base *)
             std::__cxx11::list<int,_std::allocator<int>_>::begin
                       (&(this->super_RepeatedFieldInsertionIteratorsTest).fibonacci);
  local_91 = std::
             equal<google::protobuf::internal::RepeatedIterator<int_const>,std::_List_iterator<int>>
                       (local_a0,local_a8,(_List_iterator<int>)local_b0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e0,(internal *)local_90,
               (AssertionResult *)
               "std::equal(protobuffer.repeated_int32().begin(), protobuffer.repeated_int32().end(), fibonacci.begin())"
               ,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x538,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

TEST_F(RepeatedFieldInsertionIteratorsTest, Fibonacci) {
  EXPECT_TRUE(std::equal(fibonacci.begin(), fibonacci.end(),
                         protobuffer.repeated_int32().begin()));
  EXPECT_TRUE(std::equal(protobuffer.repeated_int32().begin(),
                         protobuffer.repeated_int32().end(),
                         fibonacci.begin()));
}